

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_device.cpp
# Opt level: O1

int __thiscall booster::aio::basic_io_device::close(basic_io_device *this,int __fd)

{
  uint uVar1;
  int iVar2;
  system_error *this_00;
  error_code eVar3;
  error_code e;
  uint local_28 [2];
  error_category *local_20;
  
  local_28[0] = 0;
  local_20 = (error_category *)std::_V2::system_category();
  iVar2 = close(this,(int)local_28);
  uVar1 = local_28[0];
  if (local_28[0] == 0) {
    return iVar2;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  eVar3._4_4_ = 0;
  eVar3._M_value = uVar1;
  eVar3._M_cat = local_20;
  system::system_error::system_error(this_00,eVar3);
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void basic_io_device::close()
{
	system::error_code e;
	close(e);
	if(e)
		throw system::system_error(e);
}